

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

ErrorNumber freeLib(void)

{
  TA_RetCode TVar1;
  TA_RetCode retCode;
  ErrorNumber local_4;
  
  TVar1 = TA_Shutdown();
  if (TVar1 == TA_SUCCESS) {
    local_4 = TA_TEST_PASS;
  }
  else {
    printf("TA_Shutdown failed [%d]\n",(ulong)TVar1);
    local_4 = TA_TESTUTIL_SHUTDOWN_FAILED;
  }
  return local_4;
}

Assistant:

ErrorNumber freeLib()
{
   TA_RetCode retCode;

   /* For testing purpose */
   /* TA_FATAL_RET( "Test again", 100, 200, 0 ); */

   retCode = TA_Shutdown();
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_Shutdown failed [%d]\n", retCode );
      return TA_TESTUTIL_SHUTDOWN_FAILED;
   }

   return TA_TEST_PASS;
}